

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartList.cpp
# Opt level: O0

void __thiscall PartList::Draw(PartList *this,char *title,bool *p_open,Board *board)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  long *in_RCX;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int i;
  ImGuiListClipper clipper;
  string part_name;
  SharedVector<Component> parts;
  int height;
  int width;
  ImGuiWindowFlags in_stack_0000031c;
  bool *in_stack_00000320;
  char *in_stack_00000328;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  function<void_(const_char_*)> *in_stack_fffffffffffffed0;
  ImGuiHoveredFlags in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  size_type *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  KeyBindings *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  char *in_stack_ffffffffffffff08;
  undefined5 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1d;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff1e;
  byte bVar5;
  allocator<char> in_stack_ffffffffffffff1f;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  ImGuiListClipper *in_stack_ffffffffffffff40;
  int local_b4;
  int local_a8;
  int local_a4;
  string local_68 [32];
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> local_48;
  ImVec2 local_30;
  undefined4 uVar6;
  undefined4 uVar7;
  
  uVar7 = 400;
  uVar6 = 0x280;
  ImVec2::ImVec2(&local_30,400.0,640.0);
  ImGui::SetNextWindowSize(&local_30,0);
  ImGui::Begin(in_stack_00000328,in_stack_00000320,in_stack_0000031c);
  ImGui::Columns(CONCAT13(in_stack_fffffffffffffef7,
                          CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4)),
                 (char *)in_stack_fffffffffffffee8,SUB41((uint)in_stack_fffffffffffffee4 >> 0x18,0))
  ;
  ImGui::Separator();
  ImGui::Text("Name");
  ImGui::NextColumn();
  ImGui::Separator();
  if (in_RCX != (long *)0x0) {
    (**(code **)(*in_RCX + 0x18))();
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::vector
              (in_stack_ffffffffffffff20,
               (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT15(in_stack_ffffffffffffff1d,in_stack_ffffffffffffff18))));
    in_stack_ffffffffffffff08 = &stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,in_stack_ffffffffffffff08,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
    ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)0x1903e6);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::size
              (&local_48);
    ImGuiListClipper::Begin
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    while (in_stack_ffffffffffffff07 =
                ImGuiListClipper::Step
                          ((ImGuiListClipper *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)),
          (bool)in_stack_ffffffffffffff07) {
      for (local_b4 = local_a8; local_b4 < local_a4; local_b4 = local_b4 + 1) {
        std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
        operator[](&local_48,(long)local_b4);
        peVar3 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19046f);
        std::__cxx11::string::operator=(local_68,(string *)&peVar3->name);
        in_stack_fffffffffffffef8 = (KeyBindings *)std::__cxx11::string::c_str();
        in_stack_ffffffffffffff06 = Draw::selected == local_b4;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff44,0.0,0.0);
        in_stack_fffffffffffffef7 =
             ImGui::Selectable(in_RDX,SUB81((ulong)in_RCX >> 0x38,0),(ImGuiSelectableFlags)in_RCX,
                               (ImVec2 *)CONCAT44(uVar7,uVar6));
        if ((bool)in_stack_fffffffffffffef7) {
          Draw::selected = local_b4;
          in_stack_fffffffffffffef6 =
               ImGui::IsMouseDoubleClicked
                         ((ImGuiMouseButton)((ulong)in_stack_fffffffffffffed0 >> 0x20));
          if ((bool)in_stack_fffffffffffffef6) {
            in_stack_fffffffffffffee8 = &in_RDI->_M_string_length;
            std::__cxx11::string::c_str();
            std::function<void_(const_char_*)>::operator()
                      (in_stack_fffffffffffffed0,
                       (char *)CONCAT17(in_stack_fffffffffffffecf,
                                        CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8
                                                )));
          }
        }
        ImGui::NextColumn();
      }
    }
    ImGuiListClipper::End
              ((ImGuiListClipper *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)0x1905e7);
    std::__cxx11::string::~string(local_68);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
              ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  ImGui::Columns(CONCAT13(in_stack_fffffffffffffef7,
                          CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4)),
                 (char *)in_stack_fffffffffffffee8,SUB41((uint)in_stack_fffffffffffffee4 >> 0x18,0))
  ;
  ImGui::Separator();
  bVar1 = ImGui::IsWindowHovered(in_stack_fffffffffffffee0);
  bVar5 = 0;
  bVar4 = 0;
  bVar2 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    bVar5 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,in_stack_ffffffffffffff08,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    bVar4 = 1;
    bVar2 = KeyBindings::isPressed
                      (in_stack_fffffffffffffef8,
                       (string *)
                       CONCAT17(in_stack_fffffffffffffef7,
                                CONCAT16(in_stack_fffffffffffffef6,
                                         CONCAT24(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0))));
  }
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  }
  if ((bVar5 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
  }
  if ((bVar2 & 1) != 0) {
    *in_RDX = '\0';
  }
  ImGui::End();
  return;
}

Assistant:

void PartList::Draw(const char *title, bool *p_open, Board *board) {
	// TODO: export / fix dimensions & behaviour
	int width  = 400;
	int height = 640;

	ImGui::SetNextWindowSize(ImVec2(width, height));
	ImGui::Begin(title, p_open);

	ImGui::Columns(1, "part_infos");
	ImGui::Separator();

	ImGui::Text("Name");
	ImGui::NextColumn();
	ImGui::Separator();

	if (board) {
		auto parts = board->Components();

		static int selected = -1;
		std::string part_name    = "";
		ImGuiListClipper clipper;
		clipper.Begin(parts.size());
		while (clipper.Step()) {
			for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++) {
				part_name = parts[i]->name;

				if (ImGui::Selectable(part_name.c_str(), selected == i, ImGuiSelectableFlags_AllowDoubleClick)) {
					selected = i;
					if (ImGui::IsMouseDoubleClicked(0)) {
						cbNetSelected_(part_name.c_str());
					}
				}
				ImGui::NextColumn();
			}
		}
		clipper.End();
	}
	ImGui::Columns(1);
	ImGui::Separator();

	if (ImGui::IsWindowHovered() && keyBindings.isPressed("CloseDialog")) {
		*p_open = false;
	}

	ImGui::End();
}